

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::Process
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmServerRequest *this_00;
  __type _Var1;
  allocator local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if (0 < (int)this->m_State) {
    _Var1 = std::operator==(&request->Type,&kCACHE_TYPE_abi_cxx11_);
    if (_Var1) {
      ProcessCache(__return_storage_ptr__,this,local_20);
    }
    else {
      _Var1 = std::operator==(&local_20->Type,&kCMAKE_INPUTS_TYPE_abi_cxx11_);
      if (_Var1) {
        ProcessCMakeInputs(__return_storage_ptr__,this,local_20);
      }
      else {
        _Var1 = std::operator==(&local_20->Type,&kCODE_MODEL_TYPE_abi_cxx11_);
        if (_Var1) {
          ProcessCodeModel(__return_storage_ptr__,this,local_20);
        }
        else {
          _Var1 = std::operator==(&local_20->Type,&kCOMPUTE_TYPE_abi_cxx11_);
          if (_Var1) {
            ProcessCompute(__return_storage_ptr__,this,local_20);
          }
          else {
            _Var1 = std::operator==(&local_20->Type,&kCONFIGURE_TYPE_abi_cxx11_);
            if (_Var1) {
              ProcessConfigure(__return_storage_ptr__,this,local_20);
            }
            else {
              _Var1 = std::operator==(&local_20->Type,&kFILESYSTEM_WATCHERS_TYPE_abi_cxx11_);
              if (_Var1) {
                ProcessFileSystemWatchers(__return_storage_ptr__,this,local_20);
              }
              else {
                _Var1 = std::operator==(&local_20->Type,&kGLOBAL_SETTINGS_TYPE_abi_cxx11_);
                if (_Var1) {
                  ProcessGlobalSettings(__return_storage_ptr__,this,local_20);
                }
                else {
                  _Var1 = std::operator==(&local_20->Type,&kSET_GLOBAL_SETTINGS_TYPE_abi_cxx11_);
                  this_00 = local_20;
                  if (_Var1) {
                    ProcessSetGlobalSettings(__return_storage_ptr__,this,local_20);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_40,"Unknown command!",&local_41);
                    cmServerRequest::ReportError(__return_storage_ptr__,this_00,&local_40);
                    std::__cxx11::string::~string((string *)&local_40);
                    std::allocator<char>::~allocator((allocator<char> *)&local_41);
                  }
                }
              }
            }
          }
        }
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->m_State >= STATE_ACTIVE",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                ,0x1c6,
                "virtual const cmServerResponse cmServerProtocol1::Process(const cmServerRequest &)"
               );
}

Assistant:

const cmServerResponse cmServerProtocol1::Process(
  const cmServerRequest& request)
{
  assert(this->m_State >= STATE_ACTIVE);

  if (request.Type == kCACHE_TYPE) {
    return this->ProcessCache(request);
  }
  if (request.Type == kCMAKE_INPUTS_TYPE) {
    return this->ProcessCMakeInputs(request);
  }
  if (request.Type == kCODE_MODEL_TYPE) {
    return this->ProcessCodeModel(request);
  }
  if (request.Type == kCOMPUTE_TYPE) {
    return this->ProcessCompute(request);
  }
  if (request.Type == kCONFIGURE_TYPE) {
    return this->ProcessConfigure(request);
  }
  if (request.Type == kFILESYSTEM_WATCHERS_TYPE) {
    return this->ProcessFileSystemWatchers(request);
  }
  if (request.Type == kGLOBAL_SETTINGS_TYPE) {
    return this->ProcessGlobalSettings(request);
  }
  if (request.Type == kSET_GLOBAL_SETTINGS_TYPE) {
    return this->ProcessSetGlobalSettings(request);
  }

  return request.ReportError("Unknown command!");
}